

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::removeInteractionPairs(SimInfo *this,Molecule *mol)

{
  bool bVar1;
  size_type sVar2;
  reference ppAVar3;
  Atom *pAVar4;
  RigidBody *this_00;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_bool>
  pVar6;
  int j;
  int i_2;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms_1;
  set<int,_std::less<int>,_std::allocator<int>_> oneAtomSet;
  int i_1;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> rigidAtoms;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms;
  StuntDouble *sd;
  IntegrableObjectIterator ii;
  RigidBody *rb;
  RigidBodyIterator rbIter;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  atomGroups;
  int d;
  int c;
  int b;
  int a;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  iterator inversionIter;
  iterator torsionIter;
  iterator bendIter;
  iterator bondIter;
  ForceFieldOptions *options_;
  RigidBody *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  undefined4 in_stack_fffffffffffffc28;
  int iVar7;
  undefined4 in_stack_fffffffffffffc2c;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffffc30;
  Inversion *in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc41;
  undefined1 in_stack_fffffffffffffc42;
  undefined1 in_stack_fffffffffffffc43;
  int in_stack_fffffffffffffc44;
  Atom *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc54;
  int local_238;
  int local_234;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_230;
  _Base_ptr local_218;
  undefined1 local_210;
  int local_204;
  _Base_ptr local_1c8;
  undefined1 local_1c0;
  int local_1b4;
  _Base_ptr local_180;
  undefined1 local_178;
  int local_16c;
  int local_12c;
  _Base_ptr local_128;
  undefined1 local_120;
  int local_118;
  int local_114;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_e0;
  StuntDouble *local_b8;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_b0;
  RigidBody *local_a8;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_a0 [7];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  Inversion *local_58;
  Torsion *local_50;
  Bend *local_48;
  Bond *local_40;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_38;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_30;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  local_28;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_20;
  ForceFieldOptions *local_18;
  
  local_18 = ForceField::getForceFieldOptions(*(ForceField **)(in_RDI + 8));
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(&local_20);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  ::__normal_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  ::__normal_iterator(&local_30);
  __gnu_cxx::
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  ::__normal_iterator(&local_38);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         *)0x15fbe9);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(local_a0);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_b0);
  local_b8 = Molecule::beginIntegrableObject
                       ((Molecule *)
                        CONCAT44(in_stack_fffffffffffffc44,
                                 CONCAT13(in_stack_fffffffffffffc43,
                                          CONCAT12(in_stack_fffffffffffffc42,
                                                   CONCAT11(in_stack_fffffffffffffc41,
                                                            in_stack_fffffffffffffc40)))),
                        (iterator *)in_stack_fffffffffffffc38);
  while (local_b8 != (StuntDouble *)0x0) {
    bVar1 = StuntDouble::isRigidBody(local_b8);
    if (bVar1) {
      local_a8 = (RigidBody *)local_b8;
      RigidBody::getAtoms(in_stack_fffffffffffffc18);
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x15fca3);
      for (local_114 = 0; iVar7 = local_114,
          sVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size(&local_e0),
          iVar7 < (int)sVar2; local_114 = local_114 + 1) {
        ppAVar3 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                            (&local_e0,(long)local_114);
        local_118 = StuntDouble::getGlobalIndex(&(*ppAVar3)->super_StuntDouble);
        pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffc44,
                                    CONCAT13(in_stack_fffffffffffffc43,
                                             CONCAT12(in_stack_fffffffffffffc42,
                                                      CONCAT11(in_stack_fffffffffffffc41,
                                                               in_stack_fffffffffffffc40)))),
                           (value_type_conflict2 *)in_stack_fffffffffffffc38);
        local_128 = (_Base_ptr)pVar5.first._M_node;
        local_120 = pVar5.second;
      }
      for (local_12c = 0; iVar7 = local_12c,
          sVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size(&local_e0),
          iVar7 < (int)sVar2; local_12c = local_12c + 1) {
        ppAVar3 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                            (&local_e0,(long)local_12c);
        local_16c = StuntDouble::getGlobalIndex(&(*ppAVar3)->super_StuntDouble);
        std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>::
        pair<int,_std::set<int,_std::less<int>,_std::allocator<int>_>_&,_true>
                  ((pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   (int *)in_stack_fffffffffffffc18,
                   (set<int,_std::less<int>,_std::allocator<int>_> *)0x15fe24);
        pVar6 = std::
                map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ::insert(in_stack_fffffffffffffc30,
                         (value_type *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)
                        );
        local_180 = (_Base_ptr)pVar6.first._M_node;
        local_178 = pVar6.second;
        std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>::~pair
                  ((pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)0x15fe77
                  );
      }
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x15febd);
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                 in_stack_fffffffffffffc30);
    }
    else {
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x15fefb);
      local_1b4 = StuntDouble::getGlobalIndex(local_b8);
      pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffc44,
                                  CONCAT13(in_stack_fffffffffffffc43,
                                           CONCAT12(in_stack_fffffffffffffc42,
                                                    CONCAT11(in_stack_fffffffffffffc41,
                                                             in_stack_fffffffffffffc40)))),
                         (value_type_conflict2 *)in_stack_fffffffffffffc38);
      local_1c8 = (_Base_ptr)pVar5.first._M_node;
      local_1c0 = pVar5.second;
      local_204 = StuntDouble::getGlobalIndex(local_b8);
      std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>::
      pair<int,_std::set<int,_std::less<int>,_std::allocator<int>_>_&,_true>
                ((pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (int *)in_stack_fffffffffffffc18,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)0x15ffa4);
      pVar6 = std::
              map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::insert(in_stack_fffffffffffffc30,
                       (value_type *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      local_218 = (_Base_ptr)pVar6.first._M_node;
      local_210 = pVar6.second;
      std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>::~pair
                ((pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)0x15fff7);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x160004);
    }
    local_b8 = Molecule::nextIntegrableObject
                         ((Molecule *)
                          CONCAT44(in_stack_fffffffffffffc44,
                                   CONCAT13(in_stack_fffffffffffffc43,
                                            CONCAT12(in_stack_fffffffffffffc42,
                                                     CONCAT11(in_stack_fffffffffffffc41,
                                                              in_stack_fffffffffffffc40)))),
                          (iterator *)in_stack_fffffffffffffc38);
  }
  local_40 = Molecule::beginBond((Molecule *)
                                 CONCAT44(in_stack_fffffffffffffc44,
                                          CONCAT13(in_stack_fffffffffffffc43,
                                                   CONCAT12(in_stack_fffffffffffffc42,
                                                            CONCAT11(in_stack_fffffffffffffc41,
                                                                     in_stack_fffffffffffffc40)))),
                                 (iterator *)in_stack_fffffffffffffc38);
  while (local_40 != (Bond *)0x0) {
    pAVar4 = Bond::getAtomA((Bond *)0x1600d0);
    local_5c = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    pAVar4 = Bond::getAtomB((Bond *)0x16010b);
    local_60 = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    bVar1 = ForceFieldOptions::havevdw12scale((ForceFieldOptions *)0x160146);
    if ((bVar1) ||
       (bVar1 = ForceFieldOptions::haveelectrostatic12scale((ForceFieldOptions *)0x160169), bVar1))
    {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    else {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    local_40 = Molecule::nextBond((Molecule *)
                                  CONCAT44(in_stack_fffffffffffffc44,
                                           CONCAT13(in_stack_fffffffffffffc43,
                                                    CONCAT12(in_stack_fffffffffffffc42,
                                                             CONCAT11(in_stack_fffffffffffffc41,
                                                                      in_stack_fffffffffffffc40)))),
                                  (iterator *)in_stack_fffffffffffffc38);
  }
  local_48 = Molecule::beginBend((Molecule *)
                                 CONCAT44(in_stack_fffffffffffffc44,
                                          CONCAT13(in_stack_fffffffffffffc43,
                                                   CONCAT12(in_stack_fffffffffffffc42,
                                                            CONCAT11(in_stack_fffffffffffffc41,
                                                                     in_stack_fffffffffffffc40)))),
                                 (iterator *)in_stack_fffffffffffffc38);
  while (local_48 != (Bend *)0x0) {
    pAVar4 = Bend::getAtomA((Bend *)0x16024c);
    local_5c = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    pAVar4 = Bend::getAtomB((Bend *)0x160287);
    local_60 = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    pAVar4 = Bend::getAtomC((Bend *)0x1602c2);
    local_64 = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    bVar1 = ForceFieldOptions::havevdw12scale((ForceFieldOptions *)0x1602fd);
    if ((bVar1) ||
       (bVar1 = ForceFieldOptions::haveelectrostatic12scale((ForceFieldOptions *)0x160320), bVar1))
    {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    else {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    bVar1 = ForceFieldOptions::havevdw13scale((ForceFieldOptions *)0x1603d7);
    if ((bVar1) ||
       (bVar1 = ForceFieldOptions::haveelectrostatic13scale((ForceFieldOptions *)0x1603fa), bVar1))
    {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    else {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    local_48 = Molecule::nextBend((Molecule *)
                                  CONCAT44(in_stack_fffffffffffffc44,
                                           CONCAT13(in_stack_fffffffffffffc43,
                                                    CONCAT12(in_stack_fffffffffffffc42,
                                                             CONCAT11(in_stack_fffffffffffffc41,
                                                                      in_stack_fffffffffffffc40)))),
                                  (iterator *)in_stack_fffffffffffffc38);
  }
  local_50 = Molecule::beginTorsion
                       ((Molecule *)
                        CONCAT44(in_stack_fffffffffffffc44,
                                 CONCAT13(in_stack_fffffffffffffc43,
                                          CONCAT12(in_stack_fffffffffffffc42,
                                                   CONCAT11(in_stack_fffffffffffffc41,
                                                            in_stack_fffffffffffffc40)))),
                        (iterator *)in_stack_fffffffffffffc38);
  while (local_50 != (Torsion *)0x0) {
    pAVar4 = Torsion::getAtomA((Torsion *)0x1604dd);
    local_5c = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    pAVar4 = Torsion::getAtomB((Torsion *)0x160518);
    local_60 = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    pAVar4 = Torsion::getAtomC((Torsion *)0x160553);
    local_64 = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    pAVar4 = Torsion::getAtomD((Torsion *)0x16058e);
    local_68 = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    bVar1 = ForceFieldOptions::havevdw12scale((ForceFieldOptions *)0x1605c9);
    if ((bVar1) ||
       (bVar1 = ForceFieldOptions::haveelectrostatic12scale((ForceFieldOptions *)0x1605ec), bVar1))
    {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    else {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    bVar1 = ForceFieldOptions::havevdw13scale((ForceFieldOptions *)0x1606eb);
    if ((bVar1) ||
       (bVar1 = ForceFieldOptions::haveelectrostatic13scale((ForceFieldOptions *)0x16070e), bVar1))
    {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    else {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    bVar1 = ForceFieldOptions::havevdw14scale((ForceFieldOptions *)0x1607c5);
    if ((bVar1) ||
       (bVar1 = ForceFieldOptions::haveelectrostatic14scale((ForceFieldOptions *)0x1607e2), bVar1))
    {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    else {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    local_50 = Molecule::nextTorsion
                         ((Molecule *)
                          CONCAT44(in_stack_fffffffffffffc44,
                                   CONCAT13(in_stack_fffffffffffffc43,
                                            CONCAT12(in_stack_fffffffffffffc42,
                                                     CONCAT11(in_stack_fffffffffffffc41,
                                                              in_stack_fffffffffffffc40)))),
                          (iterator *)in_stack_fffffffffffffc38);
  }
  local_58 = Molecule::beginInversion
                       ((Molecule *)
                        CONCAT44(in_stack_fffffffffffffc44,
                                 CONCAT13(in_stack_fffffffffffffc43,
                                          CONCAT12(in_stack_fffffffffffffc42,
                                                   CONCAT11(in_stack_fffffffffffffc41,
                                                            in_stack_fffffffffffffc40)))),
                        (iterator *)in_stack_fffffffffffffc38);
  while (local_58 != (Inversion *)0x0) {
    pAVar4 = Inversion::getAtomA((Inversion *)0x1608b3);
    local_5c = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    pAVar4 = Inversion::getAtomB((Inversion *)0x1608e2);
    local_60 = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    pAVar4 = Inversion::getAtomC((Inversion *)0x160911);
    in_stack_fffffffffffffc54 = StuntDouble::getGlobalIndex(&pAVar4->super_StuntDouble);
    local_64 = in_stack_fffffffffffffc54;
    in_stack_fffffffffffffc48 = Inversion::getAtomD((Inversion *)0x160940);
    in_stack_fffffffffffffc44 =
         StuntDouble::getGlobalIndex(&in_stack_fffffffffffffc48->super_StuntDouble);
    local_68 = in_stack_fffffffffffffc44;
    in_stack_fffffffffffffc43 = ForceFieldOptions::havevdw12scale((ForceFieldOptions *)0x16096f);
    if (((bool)in_stack_fffffffffffffc43) ||
       (in_stack_fffffffffffffc42 =
             ForceFieldOptions::haveelectrostatic12scale((ForceFieldOptions *)0x16098c),
       (bool)in_stack_fffffffffffffc42)) {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    else {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    in_stack_fffffffffffffc41 = ForceFieldOptions::havevdw13scale((ForceFieldOptions *)0x160a85);
    if (((bool)in_stack_fffffffffffffc41) ||
       (in_stack_fffffffffffffc40 =
             ForceFieldOptions::haveelectrostatic13scale((ForceFieldOptions *)0x160aa2),
       (bool)in_stack_fffffffffffffc40)) {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    else {
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      PairList::removePair
                ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                 (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
    }
    in_stack_fffffffffffffc38 =
         Molecule::nextInversion
                   ((Molecule *)
                    CONCAT44(in_stack_fffffffffffffc44,
                             CONCAT13(in_stack_fffffffffffffc43,
                                      CONCAT12(in_stack_fffffffffffffc42,
                                               CONCAT11(in_stack_fffffffffffffc41,
                                                        in_stack_fffffffffffffc40)))),
                    (iterator *)in_stack_fffffffffffffc38);
    local_58 = in_stack_fffffffffffffc38;
  }
  this_00 = Molecule::beginRigidBody
                      ((Molecule *)
                       CONCAT44(in_stack_fffffffffffffc44,
                                CONCAT13(in_stack_fffffffffffffc43,
                                         CONCAT12(in_stack_fffffffffffffc42,
                                                  CONCAT11(in_stack_fffffffffffffc41,
                                                           in_stack_fffffffffffffc40)))),
                       (iterator *)in_stack_fffffffffffffc38);
  local_a8 = this_00;
  while (local_a8 != (RigidBody *)0x0) {
    RigidBody::getAtoms(in_stack_fffffffffffffc18);
    local_234 = 0;
    while (iVar7 = local_234,
          sVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size(&local_230),
          local_238 = local_234, iVar7 < (int)sVar2 + -1) {
      while( true ) {
        local_238 = local_238 + 1;
        iVar7 = local_238;
        sVar2 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size(&local_230);
        if ((int)sVar2 <= iVar7) break;
        ppAVar3 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                            (&local_230,(long)local_234);
        local_5c = StuntDouble::getGlobalIndex(&(*ppAVar3)->super_StuntDouble);
        ppAVar3 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                            (&local_230,(long)local_238);
        local_60 = StuntDouble::getGlobalIndex(&(*ppAVar3)->super_StuntDouble);
        PairList::removePair
                  ((PairList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (int)((ulong)in_stack_fffffffffffffc48 >> 0x20),(int)in_stack_fffffffffffffc48);
      }
      local_234 = local_234 + 1;
    }
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)this_00);
    in_stack_fffffffffffffc18 =
         Molecule::nextRigidBody
                   ((Molecule *)
                    CONCAT44(in_stack_fffffffffffffc44,
                             CONCAT13(in_stack_fffffffffffffc43,
                                      CONCAT12(in_stack_fffffffffffffc42,
                                               CONCAT11(in_stack_fffffffffffffc41,
                                                        in_stack_fffffffffffffc40)))),
                    (iterator *)in_stack_fffffffffffffc38);
    local_a8 = in_stack_fffffffffffffc18;
  }
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          *)0x160d93);
  return;
}

Assistant:

void SimInfo::removeInteractionPairs(Molecule* mol) {
    ForceFieldOptions& options_ = forceField_->getForceFieldOptions();
    vector<Bond*>::iterator bondIter;
    vector<Bend*>::iterator bendIter;
    vector<Torsion*>::iterator torsionIter;
    vector<Inversion*>::iterator inversionIter;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    int a;
    int b;
    int c;
    int d;

    map<int, set<int>> atomGroups;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;

    for (sd = mol->beginIntegrableObject(ii); sd != NULL;
         sd = mol->nextIntegrableObject(ii)) {
      if (sd->isRigidBody()) {
        rb                  = static_cast<RigidBody*>(sd);
        vector<Atom*> atoms = rb->getAtoms();
        set<int> rigidAtoms;
        for (int i = 0; i < static_cast<int>(atoms.size()); ++i) {
          rigidAtoms.insert(atoms[i]->getGlobalIndex());
        }
        for (int i = 0; i < static_cast<int>(atoms.size()); ++i) {
          atomGroups.insert(map<int, set<int>>::value_type(
              atoms[i]->getGlobalIndex(), rigidAtoms));
        }
      } else {
        set<int> oneAtomSet;
        oneAtomSet.insert(sd->getGlobalIndex());
        atomGroups.insert(
            map<int, set<int>>::value_type(sd->getGlobalIndex(), oneAtomSet));
      }
    }

    for (bond = mol->beginBond(bondIter); bond != NULL;
         bond = mol->nextBond(bondIter)) {
      a = bond->getAtomA()->getGlobalIndex();
      b = bond->getAtomB()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
      } else {
        excludedInteractions_.removePair(a, b);
      }
    }

    for (bend = mol->beginBend(bendIter); bend != NULL;
         bend = mol->nextBend(bendIter)) {
      a = bend->getAtomA()->getGlobalIndex();
      b = bend->getAtomB()->getGlobalIndex();
      c = bend->getAtomC()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(b, c);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(b, c);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(a, c);
      } else {
        excludedInteractions_.removePair(a, c);
      }
    }

    for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol->nextTorsion(torsionIter)) {
      a = torsion->getAtomA()->getGlobalIndex();
      b = torsion->getAtomB()->getGlobalIndex();
      c = torsion->getAtomC()->getGlobalIndex();
      d = torsion->getAtomD()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(b, c);
        oneTwoInteractions_.removePair(c, d);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(b, c);
        excludedInteractions_.removePair(c, d);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(a, c);
        oneThreeInteractions_.removePair(b, d);
      } else {
        excludedInteractions_.removePair(a, c);
        excludedInteractions_.removePair(b, d);
      }

      if (options_.havevdw14scale() || options_.haveelectrostatic14scale()) {
        oneFourInteractions_.removePair(a, d);
      } else {
        excludedInteractions_.removePair(a, d);
      }
    }

    for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
         inversion = mol->nextInversion(inversionIter)) {
      a = inversion->getAtomA()->getGlobalIndex();
      b = inversion->getAtomB()->getGlobalIndex();
      c = inversion->getAtomC()->getGlobalIndex();
      d = inversion->getAtomD()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(a, c);
        oneTwoInteractions_.removePair(a, d);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(a, c);
        excludedInteractions_.removePair(a, d);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(b, c);
        oneThreeInteractions_.removePair(b, d);
        oneThreeInteractions_.removePair(c, d);
      } else {
        excludedInteractions_.removePair(b, c);
        excludedInteractions_.removePair(b, d);
        excludedInteractions_.removePair(c, d);
      }
    }

    for (rb = mol->beginRigidBody(rbIter); rb != NULL;
         rb = mol->nextRigidBody(rbIter)) {
      vector<Atom*> atoms = rb->getAtoms();
      for (int i = 0; i < static_cast<int>(atoms.size()) - 1; ++i) {
        for (int j = i + 1; j < static_cast<int>(atoms.size()); ++j) {
          a = atoms[i]->getGlobalIndex();
          b = atoms[j]->getGlobalIndex();
          excludedInteractions_.removePair(a, b);
        }
      }
    }
  }